

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

MainFunc __thiscall capnp::compiler::CompilerMain::getMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr extendedDescription_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MainBuilder *pMVar3;
  Impl *extraout_RDX;
  Iface *extraout_RDX_00;
  CompilerMain *in_RSI;
  MainFunc MVar4;
  StringPtr version;
  StringPtr version_00;
  StringPtr briefDescription;
  StringPtr helpText;
  StringPtr briefDescription_00;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr helpText_02;
  StringPtr helpText_03;
  StringPtr helpText_04;
  StringPtr helpText_05;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  MainBuilder builder;
  MainBuilder builder_1;
  Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
  local_f8;
  Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
  local_e8;
  Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
  local_d8;
  Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
  local_c8;
  Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
  local_b8;
  Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
  local_a8;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_98;
  char *local_88;
  undefined8 uStack_80;
  char *local_78;
  undefined8 uStack_70;
  StringPtr local_68;
  StringPtr local_58;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:110:37),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:110:37)>
  local_48;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:108:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:108:39)>
  local_38;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:106:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:106:39)>
  local_28;
  
  iVar2 = (**in_RSI->context->_vptr_ProcessContext)();
  builder_1.impl.disposer = (Disposer *)CONCAT44(extraout_var,iVar2);
  builder.impl.disposer = (Disposer *)anon_var_dwarf_3ff2f;
  builder.impl.ptr = (Impl *)0x7;
  builder_1.impl.ptr = extraout_RDX;
  bVar1 = kj::StringPtr::endsWith((StringPtr *)&builder_1,(StringPtr *)&builder);
  if (!bVar1) {
    iVar2 = (**in_RSI->context->_vptr_ProcessContext)();
    local_68.content.ptr = (char *)CONCAT44(extraout_var_00,iVar2);
    local_58.content.ptr = "capnpc.exe";
    local_58.content.size_ = 0xb;
    bVar1 = kj::StringPtr::endsWith(&local_68,&local_58);
    if (!bVar1) {
      local_88 = "";
      uStack_80 = 1;
      extendedDescription_00.content.size_ = 1;
      extendedDescription_00.content.ptr = "";
      version_00.content.size_ = 0x1c;
      version_00.content.ptr = "Cap\'n Proto version 2.0-dev";
      briefDescription_00.content.size_ = 0x3d;
      briefDescription_00.content.ptr =
           "Command-line tool for Cap\'n Proto development and debugging.";
      kj::MainBuilder::MainBuilder
                (&builder_1,in_RSI->context,version_00,briefDescription_00,extendedDescription_00);
      builder.impl.disposer = (Disposer *)in_RSI;
      kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
      Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
                ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
                 &local_a8,
                 (BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:100:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:100:40)>
                  *)&builder);
      helpText_00.content.size_ = 0x28;
      helpText_00.content.ptr = "Generate source code from schema files.";
      name.content.size_ = 8;
      name.content.ptr = "compile";
      pMVar3 = kj::MainBuilder::addSubCommand
                         (&builder_1,name,
                          (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                           *)&local_a8,helpText_00);
      kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
      Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
                ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
                 &local_b8,
                 (BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:102:35),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:102:35)>
                  *)&local_68);
      helpText_01.content.size_ = 0x1a;
      helpText_01.content.ptr = "Generate a new unique ID.";
      name_00.content.size_ = 3;
      name_00.content.ptr = "id";
      pMVar3 = kj::MainBuilder::addSubCommand
                         (pMVar3,name_00,
                          (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                           *)&local_b8,helpText_01);
      local_58.content.ptr = (char *)in_RSI;
      kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
      Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
                ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
                 &local_c8,
                 (BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:104:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:104:40)>
                  *)&local_58);
      helpText_02.content.size_ = 0x32;
      helpText_02.content.ptr = "Convert messages between binary, text, JSON, etc.";
      name_01.content.size_ = 8;
      name_01.content.ptr = "convert";
      pMVar3 = kj::MainBuilder::addSubCommand
                         (pMVar3,name_01,
                          (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                           *)&local_c8,helpText_02);
      kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
      Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
                ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
                 &local_d8,&local_28);
      helpText_03.content.size_ = 0x1b;
      helpText_03.content.ptr = "DEPRECATED (use `convert`)";
      name_02.content.size_ = 7;
      name_02.content.ptr = "decode";
      pMVar3 = kj::MainBuilder::addSubCommand
                         (pMVar3,name_02,
                          (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                           *)&local_d8,helpText_03);
      kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
      Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
                ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
                 &local_e8,&local_38);
      helpText_04.content.size_ = 0x1b;
      helpText_04.content.ptr = "DEPRECATED (use `convert`)";
      name_03.content.size_ = 7;
      name_03.content.ptr = "encode";
      pMVar3 = kj::MainBuilder::addSubCommand
                         (pMVar3,name_03,
                          (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                           *)&local_e8,helpText_04);
      kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
      Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
                ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
                 &local_f8,&local_48);
      helpText_05.content.size_ = 0x25;
      helpText_05.content.ptr = "Evaluate a const from a schema file.";
      name_04.content.size_ = 5;
      name_04.content.ptr = "eval";
      kj::MainBuilder::addSubCommand
                (pMVar3,name_04,
                 (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                  *)&local_f8,helpText_05);
      kj::
      Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
      ::dispose(&local_f8);
      kj::
      Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
      ::dispose(&local_e8);
      kj::
      Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
      ::dispose(&local_d8);
      kj::
      Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
      ::dispose(&local_c8);
      kj::
      Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
      ::dispose(&local_b8);
      kj::
      Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface,_std::nullptr_t>
      ::dispose(&local_a8);
      addGlobalOptions(in_RSI,&builder_1);
      kj::MainBuilder::build((MainBuilder *)this);
      pMVar3 = &builder_1;
      goto LAB_00116066;
    }
  }
  local_78 = "";
  uStack_70 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1c;
  version.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription.content.size_ = 100;
  briefDescription.content.ptr =
       "Compiles Cap\'n Proto schema files and generates corresponding source code in one or more languages."
  ;
  kj::MainBuilder::MainBuilder
            (&builder,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&builder);
  addCompileOptions(in_RSI,&builder);
  builder_1.impl.disposer = (Disposer *)((ulong)builder_1.impl.disposer & 0xffffffffffffff00);
  builder_1.impl.ptr = (Impl *)CONCAT71(builder_1.impl.ptr._1_7_,0x69);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_98,
             (BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:94:47),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:94:47)>
              *)&local_68);
  helpText.content.size_ = 0x41;
  helpText.content.ptr = "Generate a new 64-bit unique ID for use in a Cap\'n Proto schema.";
  names._M_len = 2;
  names._M_array = (iterator)&builder_1;
  kj::MainBuilder::addOption
            (&builder,names,(Function<kj::MainBuilder::Validity_()> *)&local_98,helpText);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_98);
  kj::MainBuilder::build((MainBuilder *)this);
  pMVar3 = &builder;
LAB_00116066:
  kj::MainBuilder::~MainBuilder(pMVar3);
  MVar4.impl.ptr = extraout_RDX_00;
  MVar4.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar4.impl;
}

Assistant:

kj::MainFunc getMain() {
    if (context.getProgramName().endsWith("capnpc") || context.getProgramName().endsWith("capnpc.exe")) {
      kj::MainBuilder builder(context, VERSION_STRING,
            "Compiles Cap'n Proto schema files and generates corresponding source code in one or "
            "more languages.");
      addGlobalOptions(builder);
      addCompileOptions(builder);
      builder.addOption({'i', "generate-id"}, KJ_BIND_METHOD(*this, generateId),
                        "Generate a new 64-bit unique ID for use in a Cap'n Proto schema.");
      return builder.build();
    } else {
      kj::MainBuilder builder(context, VERSION_STRING,
            "Command-line tool for Cap'n Proto development and debugging.");
      builder.addSubCommand("compile", KJ_BIND_METHOD(*this, getCompileMain),
                            "Generate source code from schema files.")
             .addSubCommand("id", KJ_BIND_METHOD(*this, getGenIdMain),
                            "Generate a new unique ID.")
             .addSubCommand("convert", KJ_BIND_METHOD(*this, getConvertMain),
                            "Convert messages between binary, text, JSON, etc.")
             .addSubCommand("decode", KJ_BIND_METHOD(*this, getDecodeMain),
                            "DEPRECATED (use `convert`)")
             .addSubCommand("encode", KJ_BIND_METHOD(*this, getEncodeMain),
                            "DEPRECATED (use `convert`)")
             .addSubCommand("eval", KJ_BIND_METHOD(*this, getEvalMain),
                            "Evaluate a const from a schema file.");
      addGlobalOptions(builder);
      return builder.build();
    }
  }